

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall ON_Layer::PersistentLocking(ON_Layer *this)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = ON_ModelComponent::IsLocked(&this->super_ON_ModelComponent);
  if (bVar1) {
    bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
    if (bVar1) {
      bVar2 = this->m_extension_bits & 0x18;
      if (bVar2 == 8) {
        bVar1 = true;
      }
      else {
        if (bVar2 != 0x10) goto LAB_004c47c5;
        bVar1 = false;
      }
      return bVar1;
    }
  }
LAB_004c47c5:
  bVar1 = ON_ModelComponent::IsLocked(&this->super_ON_ModelComponent);
  return bVar1;
}

Assistant:

bool ON_Layer::PersistentLocking() const
{
  if ( IsLocked() && ParentIdIsNotNil() )
  {
    switch ( 0x18 & m_extension_bits )
    {
    case 0x08:
      return true;
    case 0x10:
      return false;
    }
  }

  return IsLocked();
}